

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O3

void __thiscall Utils::ArgObject::ArgObject(ArgObject *this,string *_n,string *_d)

{
  pointer pcVar1;
  
  this->_vptr_ArgObject = (_func_int **)&PTR__ArgObject_0011dbe8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + _n->_M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (_d->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + _d->_M_string_length);
  this->parsed = false;
  return;
}

Assistant:

ArgObject(const std::string& _n, const std::string& _d) :
        name(_n), description(_d), parsed(false) {}